

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

bool32 rw::Image::registerFileFormat(char *ext,fileRead read,fileWrite write)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  ImageGlobals *g;
  fileWrite write_local;
  fileRead read_local;
  char *ext_local;
  
  lVar2 = engine + imageModuleOffset;
  bVar1 = *(int *)(lVar2 + 0x100) < 10;
  if (bVar1) {
    pcVar3 = strdup_LOC(ext,0x30000,
                        "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/image.cpp line: 1030"
                       );
    *(char **)(lVar2 + 0x10 + (long)*(int *)(lVar2 + 0x100) * 0x18) = pcVar3;
    *(fileRead *)(lVar2 + (long)*(int *)(lVar2 + 0x100) * 0x18 + 0x18) = read;
    *(fileWrite *)(lVar2 + (long)*(int *)(lVar2 + 0x100) * 0x18 + 0x20) = write;
    *(int *)(lVar2 + 0x100) = *(int *)(lVar2 + 0x100) + 1;
  }
  ext_local._4_4_ = (uint)bVar1;
  return ext_local._4_4_;
}

Assistant:

bool32
Image::registerFileFormat(const char *ext, fileRead read, fileWrite write)
{
	ImageGlobals *g = PLUGINOFFSET(ImageGlobals, engine, imageModuleOffset);
	if(g->numFileFormats >= (int)nelem(g->fileFormats))
		return 0;
	g->fileFormats[g->numFileFormats].extension = rwStrdup(ext, MEMDUR_EVENT);
	g->fileFormats[g->numFileFormats].read = read;
	g->fileFormats[g->numFileFormats].write = write;
	g->numFileFormats++;
	return 1;
}